

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O1

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
HistogramBasedDistribution::toDistribution
          (HistogramBasedDistribution *this,double tailCutoff,int *offset)

{
  long lVar1;
  vector<double,std::allocator<double>> *this_00;
  iterator __position;
  double dVar2;
  int *piVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  int *piVar6;
  uint uVar7;
  int *in_RDX;
  double *pdVar8;
  pointer *__ptr;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  double dVar17;
  
  iVar15 = offset[2];
  piVar6 = *(int **)(offset + 4);
  uVar4 = *(long *)(offset + 6) - (long)piVar6 >> 4;
  uVar14 = 0xffffffff;
  dVar17 = 0.0;
  uVar12 = uVar4;
  uVar10 = 0;
  piVar3 = piVar6;
  do {
    bVar16 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar16) break;
    iVar13 = offset[3];
    if (uVar10 + 1 < uVar4) {
      iVar13 = piVar3[4] + -1;
    }
    dVar2 = (double)((iVar13 - *piVar3) + 1) * *(double *)(piVar3 + 2) + dVar17;
    if (tailCutoff < dVar2) {
      uVar14 = uVar10 & 0xffffffff;
    }
    if (tailCutoff < dVar2) {
      iVar15 = (int)((tailCutoff - dVar17) / *(double *)(piVar3 + 2)) + *piVar3;
    }
    dVar17 = (double)(~-(ulong)(dVar2 <= tailCutoff) & (ulong)dVar17 |
                     (ulong)dVar2 & -(ulong)(dVar2 <= tailCutoff));
    uVar10 = uVar10 + 1;
    piVar3 = piVar3 + 4;
  } while (dVar2 <= tailCutoff);
  piVar6 = piVar6 + uVar4 * 4;
  dVar17 = 0.0;
  uVar12 = uVar4;
  iVar13 = offset[3];
  do {
    iVar11 = offset[3];
    if (uVar12 < uVar4) {
      iVar11 = *piVar6 + -1;
    }
    pdVar8 = (double *)(piVar6 + -2);
    dVar2 = (double)((iVar11 - piVar6[-4]) + 1) * *pdVar8 + dVar17;
    piVar6 = piVar6 + -4;
    uVar12 = uVar12 - 1;
    if (tailCutoff < dVar2) {
      iVar13 = iVar11 - (int)((tailCutoff - dVar17) / *pdVar8);
    }
    dVar17 = (double)(~-(ulong)(dVar2 <= tailCutoff) & (ulong)dVar17 |
                     (ulong)dVar2 & -(ulong)(dVar2 <= tailCutoff));
  } while (dVar2 <= tailCutoff);
  pp_Var5 = (_func_int **)operator_new(0x18);
  *pp_Var5 = (_func_int *)0x0;
  pp_Var5[1] = (_func_int *)0x0;
  pp_Var5[2] = (_func_int *)0x0;
  this->_vptr_HistogramBasedDistribution = pp_Var5;
  iVar11 = iVar15;
  do {
    if (iVar13 < iVar11) break;
    lVar1 = *(long *)(offset + 4);
    uVar7 = (int)uVar14 + 1;
    uVar10 = (ulong)(int)uVar7;
    uVar12 = *(long *)(offset + 6) - lVar1 >> 4;
    bVar16 = uVar12 <= uVar10;
    if (uVar10 < uVar12) {
      iVar9 = *(int *)(lVar1 + uVar10 * 0x10) + -1;
    }
    else {
      iVar9 = offset[3];
    }
    if (iVar9 < iVar11) {
      uVar14 = (ulong)uVar7;
    }
    else {
      this_00 = (vector<double,std::allocator<double>> *)this->_vptr_HistogramBasedDistribution;
      pdVar8 = (double *)(lVar1 + (long)(int)uVar14 * 0x10 + 8);
      __position._M_current = *(double **)(this_00 + 8);
      if (__position._M_current == *(double **)(this_00 + 0x10)) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (this_00,__position,pdVar8);
      }
      else {
        *__position._M_current = *pdVar8;
        *(double **)(this_00 + 8) = __position._M_current + 1;
      }
      iVar11 = iVar11 + 1;
      bVar16 = false;
    }
  } while (!bVar16);
  *in_RDX = iVar15;
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<double> > HistogramBasedDistribution::toDistribution(double tailCutoff, int* offset) const {
	// determine start point
	int min_insert_length = min;
	int min_idx = -1;
	double p_sum = 0.0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p > tailCutoff) {
			min_insert_length = start + int((tailCutoff - p_sum) / values[i].second);
			min_idx = i;
			break;
		}
		p_sum += p;
	}
	// determine end point
	int max_insert_length = max;
	p_sum = 0.0;
	for (size_t i=values.size()-1; i>=0; --i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p > tailCutoff) {
			max_insert_length = end - int((tailCutoff - p_sum) / values[i].second);
			break;
		}
		p_sum += p;
	}
	// create result
	unique_ptr<vector<double> > result(new vector<double>());
	int k = min_idx;
	int i = min_insert_length;
	while (i <= max_insert_length) {
		int start = values[k].first;
		int end = (k+1 < values.size())? values[k+1].first-1:max;
		assert(start <= i);
		if (i > end) {
			k += 1;
			if (k >= values.size()) break;
			else continue;
		}
		result->push_back(values[k].second);
		i += 1;
	}
	*offset = min_insert_length;
	return result;
}